

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *generation_options,string *out_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  FileDescriptor *pFVar4;
  _Base_ptr p_Var5;
  undefined8 __s2;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  pointer ppFVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  long *plVar12;
  const_iterator cVar13;
  undefined8 *puVar14;
  _Rb_tree_node_base *p_Var15;
  ostream *poVar16;
  long *plVar17;
  size_type *psVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  _Alloc_hider _Var23;
  Options *pOVar24;
  string other_package_for_prefix;
  string prefix;
  string package;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  FileDescriptor *local_1d0;
  Options *local_1c8;
  string *local_1c0;
  undefined4 local_1b4;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  undefined1 local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  key_type local_a8;
  size_type local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1c0 = out_error;
  local_d0 = files;
  iVar9 = std::__cxx11::string::compare((char *)generation_options);
  if (iVar9 == 0) {
    bVar8 = 1;
    goto LAB_00273d41;
  }
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8 = generation_options;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((generation_options->expected_prefixes_path)._M_string_length == 0) {
LAB_0027287b:
    ppFVar10 = (local_d0->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    bVar7 = (local_d0->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish == ppFVar10;
    local_1b4 = (undefined4)CONCAT71((int7)((ulong)local_d0 >> 8),bVar7);
    if (!bVar7) {
      paVar1 = &local_130.field_2;
      uVar22 = 0;
      pOVar24 = local_1c8;
      do {
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           ((pOVar24->expected_prefixes_suppressions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (pOVar24->expected_prefixes_suppressions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            *(undefined8 *)ppFVar10[uVar22]);
        bVar7 = false;
        if (_Var11._M_current ==
            (pOVar24->expected_prefixes_suppressions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pFVar4 = (local_d0->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar22];
          bVar7 = pOVar24->prefixes_must_be_registered;
          bVar2 = pOVar24->require_prefixes;
          uVar3 = *(uint *)(*(long *)(pFVar4 + 0x78) + 0x28);
          local_88 = (pOVar24->expected_prefixes_path)._M_string_length;
          plVar12 = (long *)(*(ulong *)(*(long *)(pFVar4 + 0x78) + 0x60) & 0xfffffffffffffffe);
          local_170._0_8_ = local_170 + 0x10;
          lVar20 = *plVar12;
          std::__cxx11::string::_M_construct<char*>((string *)local_170,lVar20,plVar12[1] + lVar20);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          lVar20 = **(long **)(pFVar4 + 8);
          local_1d0 = pFVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,lVar20,(*(long **)(pFVar4 + 8))[1] + lVar20);
          cVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&local_80,&local_a8);
          uVar6 = local_170._8_8_;
          __s2 = local_170._0_8_;
          if ((_Rb_tree_header *)cVar13._M_node == &local_80._M_impl.super__Rb_tree_header) {
            if ((uVar3 & 8) == 0) {
              bVar8 = 1;
              if (bVar2 == false) goto LAB_002738f3;
              std::operator+(&local_130,"error: \'",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              local_1d0);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_130);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              psVar18 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_1f0.field_2._M_allocated_capacity = *psVar18;
                local_1f0.field_2._8_8_ = plVar12[3];
              }
              else {
                local_1f0.field_2._M_allocated_capacity = *psVar18;
                local_1f0._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_1f0._M_string_length = plVar12[1];
              *plVar12 = (long)psVar18;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
              puVar19 = puVar14 + 2;
              if ((ulong *)*puVar14 == puVar19) {
                local_200 = *puVar19;
                lStack_1f8 = puVar14[3];
                local_210 = &local_200;
              }
              else {
                local_200 = *puVar19;
                local_210 = (ulong *)*puVar14;
              }
              local_208 = puVar14[1];
              *puVar14 = puVar19;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_210);
              if (local_210 != &local_200) {
                operator_delete(local_210);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              _Var23._M_p = local_130._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != paVar1) {
LAB_00272eef:
                operator_delete(_Var23._M_p);
              }
LAB_00272ef4:
              bVar8 = 0;
            }
            else {
              if ((_Base_ptr)local_170._8_8_ != (_Base_ptr)0x0 && local_88 != 0) {
                local_210 = &local_200;
                local_208 = 0;
                local_200 = local_200 & 0xffffffffffffff00;
                p_Var15 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
                if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
                    &local_80._M_impl.super__Rb_tree_header) {
                  do {
                    p_Var5 = p_Var15[2]._M_parent;
                    if ((p_Var5 == (_Base_ptr)uVar6) &&
                       ((p_Var5 == (_Base_ptr)0x0 ||
                        (iVar9 = bcmp(*(void **)(p_Var15 + 2),(void *)__s2,(size_t)p_Var5),
                        iVar9 == 0)))) {
                      std::__cxx11::string::_M_assign((string *)&local_210);
                      break;
                    }
                    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  } while ((_Rb_tree_header *)p_Var15 != &local_80._M_impl.super__Rb_tree_header);
                }
                if (local_a8._M_string_length == 0) {
                  if (local_208 == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"protoc:0: warning: File \'",0x19);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)**(undefined8 **)local_1d0,
                                         (*(undefined8 **)local_1d0)[1]);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' has no ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,
                               "package. Consider adding a new package to the proto and adding \'",
                               0x40);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"new.package = ",0xe)
                    ;
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(char *)local_170._0_8_,local_170._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,"\' to the expected prefixes file (",0x21);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(local_1c8->expected_prefixes_path)._M_dataplus.
                                                 _M_p,
                                         (local_1c8->expected_prefixes_path)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16)
                    ;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"protoc:0: warning: File \'",0x19);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)**(undefined8 **)local_1d0,
                                         (*(undefined8 **)local_1d0)[1]);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,"\' has no package ",0x11);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"and package \'",0xd)
                    ;
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(char *)local_210,local_208);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,"\' already uses \'",0x10);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(char *)local_170._0_8_,local_170._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,"\' as its prefix. Consider either adding a new package ",
                               0x36);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,
                               "to the proto, or reusing one of the packages already using this ",
                               0x40);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,"prefix in the expected prefixes file (",0x26);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(local_1c8->expected_prefixes_path)._M_dataplus.
                                                 _M_p,
                                         (local_1c8->expected_prefixes_path)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16)
                    ;
                  }
                  std::ostream::put((char)poVar16);
                  std::ostream::flush();
                  std::ostream::flush();
                  bVar8 = 1;
LAB_0027359c:
                  bVar2 = false;
                }
                else {
                  if (local_208 != 0) {
                    std::operator+(&local_50,"error: Found \'option objc_class_prefix = \"",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_170);
                    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
                    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                    psVar18 = puVar14 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar14 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_c8.field_2._M_allocated_capacity = *psVar18;
                      local_c8.field_2._8_8_ = puVar14[3];
                    }
                    else {
                      local_c8.field_2._M_allocated_capacity = *psVar18;
                      local_c8._M_dataplus._M_p = (pointer)*puVar14;
                    }
                    local_c8._M_string_length = puVar14[1];
                    *puVar14 = psVar18;
                    puVar14[1] = 0;
                    *(undefined1 *)(puVar14 + 2) = 0;
                    plVar12 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_c8,**(ulong **)local_1d0);
                    local_110 = &local_100;
                    plVar17 = plVar12 + 2;
                    if ((long *)*plVar12 == plVar17) {
                      local_100 = *plVar17;
                      lStack_f8 = plVar12[3];
                    }
                    else {
                      local_100 = *plVar17;
                      local_110 = (long *)*plVar12;
                    }
                    local_108 = plVar12[1];
                    *plVar12 = (long)plVar17;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    plVar12 = (long *)std::__cxx11::string::append((char *)&local_110);
                    local_f0 = &local_e0;
                    plVar17 = plVar12 + 2;
                    if ((long *)*plVar12 == plVar17) {
                      local_e0 = *plVar17;
                      lStack_d8 = plVar12[3];
                    }
                    else {
                      local_e0 = *plVar17;
                      local_f0 = (long *)*plVar12;
                    }
                    local_e8 = plVar12[1];
                    *plVar12 = (long)plVar17;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    plVar12 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_f0,(ulong)local_210);
                    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                    psVar18 = (size_type *)(plVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_150.field_2._M_allocated_capacity = *psVar18;
                      local_150.field_2._8_8_ = plVar12[3];
                    }
                    else {
                      local_150.field_2._M_allocated_capacity = *psVar18;
                      local_150._M_dataplus._M_p = (pointer)*plVar12;
                    }
                    local_150._M_string_length = plVar12[1];
                    *plVar12 = (long)psVar18;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
                    local_1b0 = &local_1a0;
                    plVar12 = puVar14 + 2;
                    if ((long *)*puVar14 == plVar12) {
                      local_1a0 = *plVar12;
                      lStack_198 = puVar14[3];
                    }
                    else {
                      local_1a0 = *plVar12;
                      local_1b0 = (long *)*puVar14;
                    }
                    local_1a8 = puVar14[1];
                    *puVar14 = plVar12;
                    puVar14[1] = 0;
                    *(undefined1 *)(puVar14 + 2) = 0;
                    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
                    local_190 = &local_180;
                    plVar12 = puVar14 + 2;
                    if ((long *)*puVar14 == plVar12) {
                      local_180 = *plVar12;
                      lStack_178 = puVar14[3];
                    }
                    else {
                      local_180 = *plVar12;
                      local_190 = (long *)*puVar14;
                    }
                    local_188 = puVar14[1];
                    *puVar14 = plVar12;
                    puVar14[1] = 0;
                    *(undefined1 *)(puVar14 + 2) = 0;
                    puVar14 = (undefined8 *)
                              std::__cxx11::string::_M_append
                                        ((char *)&local_190,
                                         (ulong)(local_1c8->expected_prefixes_path)._M_dataplus._M_p
                                        );
                    psVar18 = puVar14 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar14 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_130.field_2._M_allocated_capacity = *psVar18;
                      local_130.field_2._8_8_ = puVar14[3];
                      local_130._M_dataplus._M_p = (pointer)paVar1;
                    }
                    else {
                      local_130.field_2._M_allocated_capacity = *psVar18;
                      local_130._M_dataplus._M_p = (pointer)*puVar14;
                    }
                    local_130._M_string_length = puVar14[1];
                    *puVar14 = psVar18;
                    puVar14[1] = 0;
                    *(undefined1 *)(puVar14 + 2) = 0;
                    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
                    psVar18 = puVar14 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar14 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_1f0.field_2._M_allocated_capacity = *psVar18;
                      local_1f0.field_2._8_8_ = puVar14[3];
                      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    }
                    else {
                      local_1f0.field_2._M_allocated_capacity = *psVar18;
                      local_1f0._M_dataplus._M_p = (pointer)*puVar14;
                    }
                    local_1f0._M_string_length = puVar14[1];
                    *puVar14 = psVar18;
                    puVar14[1] = 0;
                    *(undefined1 *)(puVar14 + 2) = 0;
                    std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_1f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != paVar1) {
                      operator_delete(local_130._M_dataplus._M_p);
                    }
                    if (local_190 != &local_180) {
                      operator_delete(local_190);
                    }
                    if (local_1b0 != &local_1a0) {
                      operator_delete(local_1b0);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_150._M_dataplus._M_p != &local_150.field_2) {
                      operator_delete(local_150._M_dataplus._M_p);
                    }
                    if (local_f0 != &local_e0) {
                      operator_delete(local_f0);
                    }
                    if (local_110 != &local_100) {
                      operator_delete(local_110);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p);
                    }
                    bVar8 = 0;
                    goto LAB_0027359c;
                  }
                  bVar2 = true;
                  bVar8 = 0;
                }
                if (local_210 != &local_200) {
                  operator_delete(local_210);
                }
                if (!bVar2) goto LAB_002738f3;
              }
              if (((_Base_ptr)local_170._8_8_ != (_Base_ptr)0x0) &&
                 (0x19 < (byte)(*(char *)local_170._0_8_ + 0xbfU))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_170._0_8_,local_170._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\";\' in \'",8);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)**(undefined8 **)local_1d0,
                                     (*(undefined8 **)local_1d0)[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\';",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16," it should start with a capital letter.",0x27);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
                std::ostream::put((char)poVar16);
                std::ostream::flush();
                std::ostream::flush();
              }
              if ((undefined1 *)((long)&((_Base_ptr)(local_170._8_8_ + -0x20))->_M_right + 7) <
                  (undefined1 *)0x2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_170._0_8_,local_170._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\";\' in \'",8);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)**(undefined8 **)local_1d0,
                                     (*(undefined8 **)local_1d0)[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\';",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16," Apple recommends they should be at least 3 characters long.",
                           0x3c);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
                std::ostream::put((char)poVar16);
                std::ostream::flush();
                std::ostream::flush();
              }
              bVar8 = 1;
              if (local_88 != 0) {
                if (bVar7 != false) {
                  std::operator+(&local_c8,"error: \'",
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)local_1d0);
                  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
                  local_110 = &local_100;
                  plVar12 = puVar14 + 2;
                  if ((long *)*puVar14 == plVar12) {
                    local_100 = *plVar12;
                    lStack_f8 = puVar14[3];
                  }
                  else {
                    local_100 = *plVar12;
                    local_110 = (long *)*puVar14;
                  }
                  local_108 = puVar14[1];
                  *puVar14 = plVar12;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_110,local_170._0_8_);
                  local_f0 = &local_e0;
                  plVar12 = puVar14 + 2;
                  if ((long *)*puVar14 == plVar12) {
                    local_e0 = *plVar12;
                    lStack_d8 = puVar14[3];
                  }
                  else {
                    local_e0 = *plVar12;
                    local_f0 = (long *)*puVar14;
                  }
                  local_e8 = puVar14[1];
                  *puVar14 = plVar12;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
                  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                  psVar18 = puVar14 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_150.field_2._M_allocated_capacity = *psVar18;
                    local_150.field_2._8_8_ = puVar14[3];
                  }
                  else {
                    local_150.field_2._M_allocated_capacity = *psVar18;
                    local_150._M_dataplus._M_p = (pointer)*puVar14;
                  }
                  local_150._M_string_length = puVar14[1];
                  *puVar14 = psVar18;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
                  local_1b0 = &local_1a0;
                  plVar12 = puVar14 + 2;
                  if ((long *)*puVar14 == plVar12) {
                    local_1a0 = *plVar12;
                    lStack_198 = puVar14[3];
                  }
                  else {
                    local_1a0 = *plVar12;
                    local_1b0 = (long *)*puVar14;
                  }
                  local_1a8 = puVar14[1];
                  *puVar14 = plVar12;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_1b0,
                                       (ulong)(local_1c8->expected_prefixes_path)._M_dataplus._M_p);
                  local_190 = &local_180;
                  plVar12 = puVar14 + 2;
                  if ((long *)*puVar14 == plVar12) {
                    local_180 = *plVar12;
                    lStack_178 = puVar14[3];
                  }
                  else {
                    local_180 = *plVar12;
                    local_190 = (long *)*puVar14;
                  }
                  local_188 = puVar14[1];
                  *puVar14 = plVar12;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
                  psVar18 = puVar14 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_130.field_2._M_allocated_capacity = *psVar18;
                    local_130.field_2._8_8_ = puVar14[3];
                    local_130._M_dataplus._M_p = (pointer)paVar1;
                  }
                  else {
                    local_130.field_2._M_allocated_capacity = *psVar18;
                    local_130._M_dataplus._M_p = (pointer)*puVar14;
                  }
                  local_130._M_string_length = puVar14[1];
                  *puVar14 = psVar18;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_130,(ulong)local_a8._M_dataplus._M_p);
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  psVar18 = puVar14 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_1f0.field_2._M_allocated_capacity = *psVar18;
                    local_1f0.field_2._8_8_ = puVar14[3];
                  }
                  else {
                    local_1f0.field_2._M_allocated_capacity = *psVar18;
                    local_1f0._M_dataplus._M_p = (pointer)*puVar14;
                  }
                  local_1f0._M_string_length = puVar14[1];
                  *puVar14 = psVar18;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
                  puVar19 = puVar14 + 2;
                  if ((ulong *)*puVar14 == puVar19) {
                    local_200 = *puVar19;
                    lStack_1f8 = puVar14[3];
                    local_210 = &local_200;
                  }
                  else {
                    local_200 = *puVar19;
                    local_210 = (ulong *)*puVar14;
                  }
                  local_208 = puVar14[1];
                  *puVar14 = puVar19;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_210);
                  if (local_210 != &local_200) {
                    operator_delete(local_210);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != paVar1) {
                    operator_delete(local_130._M_dataplus._M_p);
                  }
                  if (local_190 != &local_180) {
                    operator_delete(local_190);
                  }
                  if (local_1b0 != &local_1a0) {
                    operator_delete(local_1b0);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_150._M_dataplus._M_p != &local_150.field_2) {
                    operator_delete(local_150._M_dataplus._M_p);
                  }
                  if (local_f0 != &local_e0) {
                    operator_delete(local_f0);
                  }
                  if (local_110 != &local_100) {
                    operator_delete(local_110);
                  }
                  _Var23._M_p = local_c8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_00272eef;
                  goto LAB_00272ef4;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "protoc:0: warning: Found unexpected \'option objc_class_prefix = \"",
                           0x41);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_170._0_8_,local_170._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\";\' in \'",8);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)**(undefined8 **)local_1d0,
                                     (*(undefined8 **)local_1d0)[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\';",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16," consider adding it to the expected prefixes file (",0x33);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(local_1c8->expected_prefixes_path)._M_dataplus._M_p,
                                     (local_1c8->expected_prefixes_path)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
                std::ostream::put((char)poVar16);
                std::ostream::flush();
                std::ostream::flush();
              }
            }
          }
          else if ((((uVar3 & 8) == 0) ||
                   (p_Var5 = cVar13._M_node[2]._M_parent, p_Var5 != (_Base_ptr)local_170._8_8_)) ||
                  ((bVar8 = 1, p_Var5 != (_Base_ptr)0x0 &&
                   (iVar9 = bcmp(*(void **)(cVar13._M_node + 2),(void *)local_170._0_8_,
                                 (size_t)p_Var5), iVar9 != 0)))) {
            std::operator+(&local_150,"error: Expected \'option objc_class_prefix = \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (cVar13._M_node + 2));
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
            local_1b0 = &local_1a0;
            plVar17 = plVar12 + 2;
            if ((long *)*plVar12 == plVar17) {
              local_1a0 = *plVar17;
              lStack_198 = plVar12[3];
            }
            else {
              local_1a0 = *plVar17;
              local_1b0 = (long *)*plVar12;
            }
            local_1a8 = plVar12[1];
            *plVar12 = (long)plVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1b0,(ulong)local_a8._M_dataplus._M_p);
            local_190 = &local_180;
            plVar17 = plVar12 + 2;
            if ((long *)*plVar12 == plVar17) {
              local_180 = *plVar17;
              lStack_178 = plVar12[3];
            }
            else {
              local_180 = *plVar17;
              local_190 = (long *)*plVar12;
            }
            local_188 = plVar12[1];
            *plVar12 = (long)plVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_190);
            psVar18 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_130.field_2._M_allocated_capacity = *psVar18;
              local_130.field_2._8_8_ = plVar12[3];
              local_130._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_130.field_2._M_allocated_capacity = *psVar18;
              local_130._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_130._M_string_length = plVar12[1];
            *plVar12 = (long)psVar18;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_130,**(ulong **)local_1d0);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar18 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_1f0.field_2._M_allocated_capacity = *psVar18;
              local_1f0.field_2._8_8_ = puVar14[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar18;
              local_1f0._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_1f0._M_string_length = puVar14[1];
            *puVar14 = psVar18;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_1f0);
            puVar19 = (ulong *)(plVar12 + 2);
            if ((ulong *)*plVar12 == puVar19) {
              local_200 = *puVar19;
              lStack_1f8 = plVar12[3];
              local_210 = &local_200;
            }
            else {
              local_200 = *puVar19;
              local_210 = (ulong *)*plVar12;
            }
            local_208 = plVar12[1];
            *plVar12 = (long)puVar19;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_210);
            if (local_210 != &local_200) {
              operator_delete(local_210);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != paVar1) {
              operator_delete(local_130._M_dataplus._M_p);
            }
            if (local_190 != &local_180) {
              operator_delete(local_190);
            }
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
            if ((uVar3 & 8) != 0) {
              std::operator+(&local_1f0,"; but found \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_170);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
              puVar19 = puVar14 + 2;
              if ((ulong *)*puVar14 == puVar19) {
                local_200 = *puVar19;
                lStack_1f8 = puVar14[3];
                local_210 = &local_200;
              }
              else {
                local_200 = *puVar19;
                local_210 = (ulong *)*puVar14;
              }
              local_208 = puVar14[1];
              *puVar14 = puVar19;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_210);
              if (local_210 != &local_200) {
                operator_delete(local_210);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
            }
            bVar8 = 0;
            std::__cxx11::string::append((char *)local_1c0);
          }
LAB_002738f3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_);
          }
          bVar7 = (bool)(bVar8 ^ 1);
          pOVar24 = local_1c8;
        }
        if (bVar7) break;
        uVar22 = uVar22 + 1;
        ppFVar10 = (local_d0->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)(local_d0->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10;
        uVar21 = lVar20 >> 3;
        local_1b4 = (undefined4)CONCAT71((int7)(lVar20 >> 0xb),uVar21 <= uVar22);
      } while (uVar22 < uVar21);
    }
  }
  else {
    local_170._0_8_ = &PTR__LineConsumer_004ddc58;
    local_170._8_8_ = &local_80;
    bVar7 = ParseSimpleFile(&generation_options->expected_prefixes_path,(LineConsumer *)local_170,
                            local_1c0);
    if (bVar7) goto LAB_0027287b;
    local_1b4 = 0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_80);
  bVar8 = (byte)local_1b4;
LAB_00273d41:
  return (bool)(bVar8 & 1);
}

Assistant:

bool ValidateObjCClassPrefixes(const std::vector<const FileDescriptor*>& files,
                               const Options& generation_options,
                               std::string* out_error) {
  // Allow a '-' as the path for the expected prefixes to completely disable
  // even the most basic of checks.
  if (generation_options.expected_prefixes_path == "-") {
    return true;
  }

  // Load the expected package prefixes, if available, to validate against.
  std::map<std::string, std::string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(generation_options,
                                   &expected_package_prefixes,
                                   out_error)) {
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    bool should_skip =
      (std::find(generation_options.expected_prefixes_suppressions.begin(),
                 generation_options.expected_prefixes_suppressions.end(),
                 files[i]->name())
          != generation_options.expected_prefixes_suppressions.end());
    if (should_skip) {
      continue;
    }

    bool is_valid =
        ValidateObjCClassPrefix(files[i],
                                generation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                generation_options.prefixes_must_be_registered,
                                generation_options.require_prefixes,
                                out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}